

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O2

Quat4f operator*(float f,Quat4f *q)

{
  undefined1 auVar1 [16];
  undefined1 (*in_RSI) [16];
  Quat4f QVar2;
  
  auVar1 = *in_RSI;
  QVar2.m_elements._8_8_ = auVar1._0_8_;
  QVar2.m_elements[0] = f * auVar1._0_4_;
  QVar2.m_elements[1] = f * auVar1._4_4_;
  q->m_elements[0] = QVar2.m_elements[0];
  q->m_elements[1] = QVar2.m_elements[1];
  q->m_elements[2] = f * auVar1._8_4_;
  q->m_elements[3] = f * auVar1._12_4_;
  return (Quat4f)QVar2.m_elements;
}

Assistant:

Quat4f operator * ( float f, const Quat4f& q )
{
	return Quat4f
	(
		f * q.w(),
		f * q.x(),
		f * q.y(),
		f * q.z()
	);
}